

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProductTest.cpp
# Opt level: O1

void __thiscall CardProdNoAllocation::test_method(CardProdNoAllocation *this)

{
  void *size;
  void *size_00;
  double *__ptr;
  double *__ptr_00;
  double *__ptr_01;
  void *pvVar1;
  undefined8 *puVar2;
  char *pcVar3;
  Index cols;
  Index outer_stride_1;
  VectorXd x;
  MatrixXd J1;
  VectorXd p;
  VectorXd y;
  MatrixXd H2;
  MatrixXd H1;
  MatrixXd H0;
  MatrixXd J0;
  CartesianProduct S;
  CartesianProduct R2R3R2;
  CartesianProduct SO3R2R3R2;
  SO3<mnf::ExpMapMatrix> RotSpace;
  RealSpace R2;
  RealSpace R3;
  void *local_668;
  ulong uStack_660;
  void *local_650;
  undefined8 uStack_648;
  void *local_638;
  ulong local_630;
  void *local_628;
  void *pvStack_620;
  undefined8 local_618;
  void *pvStack_610;
  undefined8 uStack_608;
  void *local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  double *local_5e8;
  ulong uStack_5e0;
  void *local_5d8;
  void *local_5c8;
  ulong local_5c0;
  void *local_5b8;
  ulong uStack_5b0;
  void *local_5a0;
  undefined8 uStack_598;
  void *local_588;
  ulong local_580;
  void *local_578;
  ulong local_570;
  ulong local_568;
  void *local_560;
  ulong local_558;
  ulong local_550;
  void *local_548 [3];
  void *local_530 [3];
  void *local_518;
  ulong uStack_510;
  ulong local_508;
  ulong uStack_500;
  void *local_4e8;
  ulong uStack_4e0;
  ulong local_4d8;
  ulong uStack_4d0;
  double *local_4b8;
  undefined8 uStack_4b0;
  void *local_4a8;
  undefined8 uStack_4a0;
  double *local_488;
  ulong uStack_480;
  void *local_478;
  ulong uStack_470;
  double *local_458;
  undefined8 uStack_450;
  void *local_448;
  undefined8 uStack_440;
  double *local_428;
  ulong uStack_420;
  void *local_418;
  ulong uStack_410;
  double *local_3f8;
  void *pvStack_3f0;
  double *local_3d8;
  void *pvStack_3d0;
  double *local_3b8;
  void *pvStack_3b0;
  code *local_3a0 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_348 [24];
  void *local_330;
  void *local_318;
  code *local_300 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_2a8 [24];
  void *local_290;
  void *local_278;
  code *local_260 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_208 [24];
  void *local_1f0;
  void *local_1d8;
  SO3<mnf::ExpMapMatrix> local_1c0;
  code *local_120 [11];
  void *local_c8;
  void *local_b8;
  code *local_a8 [11];
  void *local_50;
  void *local_40;
  
  mnf::RealSpace::RealSpace((RealSpace *)local_120,2);
  mnf::RealSpace::RealSpace((RealSpace *)local_a8,3);
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&local_1c0);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)local_300,(Manifold *)local_120,(Manifold *)local_a8);
  mnf::CartesianProduct::multiply((Manifold *)local_300);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)local_260,&local_1c0.super_Manifold,(Manifold *)local_300);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)local_3a0,(Manifold *)local_260,&local_1c0.super_Manifold);
  size = (void *)mnf::Manifold::dim();
  size_00 = (void *)mnf::Manifold::representationDim();
  local_628 = size_00;
  if (-1 < (long)size_00) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_638,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_628);
    local_628 = size;
    if (-1 < (long)size) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_5c8,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_628);
      local_628 = size_00;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_588,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_628);
      if (size_00 == (void *)0x0) {
        __ptr = (double *)0x0;
      }
      else {
        __ptr = Eigen::internal::conditional_aligned_new_auto<double,true>((size_t)size_00);
      }
      if (size == (void *)0x0) {
        __ptr_00 = (double *)0x0;
      }
      else {
        __ptr_00 = Eigen::internal::conditional_aligned_new_auto<double,true>((size_t)size);
      }
      local_628 = (void *)0x64;
      pvStack_620 = size_00;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_530,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_628);
      local_5e8 = (double *)0x0;
      uStack_5e0 = 0;
      local_5d8 = (void *)0x0;
      if ((void *)0x147ae147ae147ae < size) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = operator_delete;
        __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      if ((long)size * -100 != 0) {
        free((void *)0x0);
        if (size == (void *)0x0) {
          local_5e8 = (double *)0x0;
        }
        else {
          local_5e8 = Eigen::internal::conditional_aligned_new_auto<double,true>((long)size * 100);
        }
      }
      uStack_5e0 = 100;
      local_5d8 = size;
      if ((void *)0x147ae147ae147ae < size_00) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = operator_delete;
        __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      if (size_00 == (void *)0x0) {
        __ptr_01 = (double *)0x0;
      }
      else {
        __ptr_01 = Eigen::internal::conditional_aligned_new_auto<double,true>((long)size_00 * 100);
      }
      pvVar1 = (void *)mnf::Manifold::dim();
      pvStack_620 = (void *)mnf::Manifold::dim();
      local_628 = pvVar1;
      if (-1 < (long)((ulong)pvStack_620 | (ulong)pvVar1)) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_548,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_628);
        pvVar1 = (void *)mnf::Manifold::dim();
        pvStack_620 = (void *)mnf::Manifold::dim();
        local_628 = pvVar1;
        if (-1 < (long)((ulong)pvStack_620 | (ulong)pvVar1)) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_560,
                     (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)&local_628);
          pvVar1 = (void *)mnf::Manifold::dim();
          pvStack_620 = (void *)mnf::Manifold::dim();
          local_628 = pvVar1;
          if (-1 < (long)((ulong)pvStack_620 | (ulong)pvVar1)) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_578,
                       (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        *)&local_628);
            uStack_410 = 0;
            local_428 = local_5e8;
            uStack_420 = uStack_5e0;
            local_418 = local_5d8;
            if ((long)((ulong)local_5d8 | uStack_5e0) < 0 && local_5e8 != (double *)0x0)
            goto LAB_0012a797;
            uStack_410 = uStack_5e0;
            local_618 = 0;
            pvStack_610 = (void *)0x0;
            local_628 = (void *)0x0;
            pvStack_620 = (void *)0x0;
            local_600 = (void *)0x0;
            uStack_5f8 = 0;
            local_5f0 = 0;
            Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
            construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                       &local_628,local_530);
            local_650 = (void *)0x0;
            uStack_648 = 0;
            local_668 = local_638;
            uStack_660 = local_630;
            if (-1 < (long)local_630 || local_638 == (void *)0x0) {
              mnf::Manifold::applyDiffRetractation(local_3a0,&local_428,&local_628,&local_668);
              free(local_650);
              free(local_600);
              uStack_450 = 100;
              uStack_440 = 100;
              local_618 = 0;
              pvStack_610 = (void *)0x0;
              local_628 = (void *)0x0;
              pvStack_620 = (void *)0x0;
              local_600 = (void *)0x0;
              uStack_5f8 = 0;
              local_5f0 = 0;
              local_458 = __ptr_01;
              local_448 = size_00;
              Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
              construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                        ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                         &local_628,&local_5e8);
              local_650 = (void *)0x0;
              uStack_648 = 0;
              local_668 = local_638;
              uStack_660 = local_630;
              if (-1 < (long)local_630 || local_638 == (void *)0x0) {
                mnf::Manifold::applyDiffPseudoLog0(local_3a0,&local_458,&local_628,&local_668);
                free(local_650);
                free(local_600);
                Eigen::internal::is_malloc_allowed_impl(bool,bool)::value = 0;
                mnf::utils::set_is_malloc_allowed(false);
                pvStack_610 = (void *)0x0;
                uStack_608 = 0;
                local_628 = local_638;
                pvStack_620 = (void *)local_630;
                local_3b8 = __ptr;
                pvStack_3b0 = size_00;
                if (-1 < (long)local_630 || local_638 == (void *)0x0) {
                  local_650 = (void *)0x0;
                  uStack_648 = 0;
                  local_668 = local_5c8;
                  uStack_660 = local_5c0;
                  if (-1 < (long)local_5c0 || local_5c8 == (void *)0x0) {
                    mnf::Manifold::retractation(local_3a0,&local_3b8,&local_628,&local_668);
                    free(local_650);
                    free(pvStack_610);
                    pvStack_610 = (void *)0x0;
                    uStack_608 = 0;
                    local_628 = local_588;
                    pvStack_620 = (void *)local_580;
                    local_3d8 = __ptr_00;
                    pvStack_3d0 = size;
                    if (-1 < (long)local_580 || local_588 == (void *)0x0) {
                      local_650 = (void *)0x0;
                      uStack_648 = 0;
                      local_668 = local_638;
                      uStack_660 = local_630;
                      if (-1 < (long)local_630 || local_638 == (void *)0x0) {
                        mnf::Manifold::pseudoLog(local_3a0,&local_3d8,&local_628,&local_668);
                        free(local_650);
                        free(pvStack_610);
                        pvStack_610 = (void *)0x0;
                        uStack_608 = 0;
                        local_628 = local_638;
                        pvStack_620 = (void *)local_630;
                        local_3f8 = __ptr_00;
                        pvStack_3f0 = size;
                        if (-1 < (long)local_630 || local_638 == (void *)0x0) {
                          mnf::Manifold::pseudoLog0(local_3a0,&local_3f8,&local_628);
                          free(pvStack_610);
                          uStack_470 = 0;
                          local_488 = local_5e8;
                          uStack_480 = uStack_5e0;
                          local_478 = local_5d8;
                          if ((long)((ulong)local_5d8 | uStack_5e0) < 0 &&
                              local_5e8 != (double *)0x0) {
LAB_0012a797:
                            pcVar3 = 
                            "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1>>, Level = 0]"
                            ;
                            goto LAB_0012a7ac;
                          }
                          uStack_470 = uStack_5e0;
                          local_618 = 0;
                          pvStack_610 = (void *)0x0;
                          local_628 = (void *)0x0;
                          pvStack_620 = (void *)0x0;
                          local_600 = (void *)0x0;
                          uStack_5f8 = 0;
                          local_5f0 = 0;
                          Eigen::
                          Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
                          construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                                    ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>
                                      *)&local_628,local_530);
                          local_650 = (void *)0x0;
                          uStack_648 = 0;
                          local_668 = local_638;
                          uStack_660 = local_630;
                          if (-1 < (long)local_630 || local_638 == (void *)0x0) {
                            mnf::Manifold::applyDiffRetractation
                                      (local_3a0,&local_488,&local_628,&local_668);
                            free(local_650);
                            free(local_600);
                            uStack_4b0 = 100;
                            uStack_4a0 = 100;
                            local_618 = 0;
                            pvStack_610 = (void *)0x0;
                            local_628 = (void *)0x0;
                            pvStack_620 = (void *)0x0;
                            local_600 = (void *)0x0;
                            uStack_5f8 = 0;
                            local_5f0 = 0;
                            local_4b8 = __ptr_01;
                            local_4a8 = size_00;
                            Eigen::
                            Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
                            construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                                      ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>
                                        *)&local_628,&local_5e8);
                            local_650 = (void *)0x0;
                            uStack_648 = 0;
                            local_668 = local_638;
                            uStack_660 = local_630;
                            if (-1 < (long)local_630 || local_638 == (void *)0x0) {
                              mnf::Manifold::applyDiffPseudoLog0
                                        (local_3a0,&local_4b8,&local_628,&local_668);
                              free(local_650);
                              free(local_600);
                              uStack_4d0 = 0;
                              local_4e8 = local_560;
                              uStack_4e0 = local_558;
                              local_4d8 = local_550;
                              if ((long)(local_550 | local_558) < 0 && local_560 != (void *)0x0)
                              goto LAB_0012a797;
                              uStack_4d0 = local_558;
                              local_618 = 0;
                              pvStack_610 = (void *)0x0;
                              local_628 = (void *)0x0;
                              pvStack_620 = (void *)0x0;
                              local_600 = (void *)0x0;
                              uStack_5f8 = 0;
                              local_5f0 = 0;
                              Eigen::
                              Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>
                              ::construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                                        ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>
                                          *)&local_628,local_548);
                              local_650 = (void *)0x0;
                              uStack_648 = 0;
                              local_668 = local_638;
                              uStack_660 = local_630;
                              if (-1 < (long)local_630 || local_638 == (void *)0x0) {
                                local_5a0 = (void *)0x0;
                                uStack_598 = 0;
                                local_5b8 = local_5c8;
                                uStack_5b0 = local_5c0;
                                if (-1 < (long)local_5c0 || local_5c8 == (void *)0x0) {
                                  mnf::Manifold::applyTransport
                                            (local_3a0,&local_4e8,&local_628,&local_668,&local_5b8);
                                  free(local_5a0);
                                  free(local_650);
                                  free(local_600);
                                  uStack_500 = 0;
                                  local_518 = local_578;
                                  uStack_510 = local_570;
                                  local_508 = local_568;
                                  if ((long)(local_568 | local_570) < 0 && local_578 != (void *)0x0)
                                  goto LAB_0012a797;
                                  uStack_500 = local_570;
                                  local_618 = 0;
                                  pvStack_610 = (void *)0x0;
                                  local_628 = (void *)0x0;
                                  pvStack_620 = (void *)0x0;
                                  local_600 = (void *)0x0;
                                  uStack_5f8 = 0;
                                  local_5f0 = 0;
                                  Eigen::
                                  Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>
                                  ::construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                                            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>
                                              *)&local_628,local_548);
                                  local_650 = (void *)0x0;
                                  uStack_648 = 0;
                                  local_668 = local_638;
                                  uStack_660 = local_630;
                                  if (-1 < (long)local_630 || local_638 == (void *)0x0) {
                                    local_5a0 = (void *)0x0;
                                    uStack_598 = 0;
                                    local_5b8 = local_5c8;
                                    uStack_5b0 = local_5c0;
                                    if (-1 < (long)local_5c0 || local_5c8 == (void *)0x0) {
                                      mnf::Manifold::applyInvTransportOnTheRight
                                                (local_3a0,&local_518,&local_628,&local_668,
                                                 &local_5b8);
                                      free(local_5a0);
                                      free(local_650);
                                      free(local_600);
                                      mnf::utils::set_is_malloc_allowed(true);
                                      Eigen::internal::is_malloc_allowed_impl(bool,bool)::value = 1;
                                      free(local_578);
                                      free(local_560);
                                      free(local_548[0]);
                                      free(__ptr_01);
                                      free(local_5e8);
                                      free(local_530[0]);
                                      free(__ptr_00);
                                      free(__ptr);
                                      free(local_588);
                                      free(local_5c8);
                                      free(local_638);
                                      local_3a0[0] = free;
                                      if (local_318 != (void *)0x0) {
                                        operator_delete(local_318);
                                      }
                                      if (local_330 != (void *)0x0) {
                                        operator_delete(local_330);
                                      }
                                      std::
                                      vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                                      ::~vector(local_348);
                                      mnf::Manifold::~Manifold((Manifold *)local_3a0);
                                      local_260[0] = free;
                                      if (local_1d8 != (void *)0x0) {
                                        operator_delete(local_1d8);
                                      }
                                      if (local_1f0 != (void *)0x0) {
                                        operator_delete(local_1f0);
                                      }
                                      std::
                                      vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                                      ::~vector(local_208);
                                      mnf::Manifold::~Manifold((Manifold *)local_260);
                                      local_300[0] = free;
                                      if (local_278 != (void *)0x0) {
                                        operator_delete(local_278);
                                      }
                                      if (local_290 != (void *)0x0) {
                                        operator_delete(local_290);
                                      }
                                      std::
                                      vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                                      ::~vector(local_2a8);
                                      mnf::Manifold::~Manifold((Manifold *)local_300);
                                      local_1c0._0_8_ = &PTR__SO3_00144670;
                                      mnf::ReusableTemporaryMap::~ReusableTemporaryMap
                                                ((ReusableTemporaryMap *)((long)&local_1c0 + 0x58));
                                      mnf::Manifold::~Manifold(&local_1c0.super_Manifold);
                                      local_a8[0] = std::terminate;
                                      free(local_40);
                                      free(local_50);
                                      mnf::Manifold::~Manifold((Manifold *)local_a8);
                                      local_120[0] = std::terminate;
                                      free(local_b8);
                                      free(local_c8);
                                      mnf::Manifold::~Manifold((Manifold *)local_120);
                                      return;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            pcVar3 = 
            "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
            ;
LAB_0012a7ac:
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar3);
          }
        }
      }
      pcVar3 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
      ;
      goto LAB_0012a7e2;
    }
  }
  pcVar3 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_0012a7e2:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar3);
}

Assistant:

BOOST_AUTO_TEST_CASE(CardProdNoAllocation)
{
  // We only test here that the operations on the manifold do not create
  // temporary. Passing arguments that are not recognize by the Eigen::Ref will
  // create temporaries, but this is the user's fault.
  const int r = 100;
  RealSpace R2(2);
  RealSpace R3(3);
  SO3<ExpMapMatrix> RotSpace;
  CartesianProduct R2R3R2(R2, R3);
  R2R3R2.multiply(R2);
  CartesianProduct SO3R2R3R2(RotSpace, R2R3R2);
  CartesianProduct S(SO3R2R3R2, RotSpace);
  Index dim = S.dim();
  Index repDim = S.representationDim();
  Eigen::VectorXd x = Eigen::VectorXd::Random(repDim);
  Eigen::VectorXd p = Eigen::VectorXd::Random(dim);
  Eigen::VectorXd y = Eigen::VectorXd::Random(repDim);
  Eigen::VectorXd z(repDim);
  Eigen::VectorXd d(dim);
  Eigen::MatrixXd J0 = Eigen::MatrixXd::Random(r, repDim);
  Eigen::MatrixXd J1(r, dim);
  Eigen::MatrixXd J2(r, repDim);
  Eigen::MatrixXd H0 = Eigen::MatrixXd::Random(S.dim(), S.dim());
  Eigen::MatrixXd H1 = Eigen::MatrixXd::Random(S.dim(), S.dim());
  Eigen::MatrixXd H2 = Eigen::MatrixXd::Random(S.dim(), S.dim());

  // The first call to the following methods might trigger a memory allocation
  // depending on the size of the Ji and the initial buffer size inside S.
  // However, subsequent calls should not require any allocation, what we check
  // after.
  S.applyDiffRetractation(J1, J0, x);
  S.applyDiffPseudoLog0(J2, J1, x);

  Eigen::internal::set_is_malloc_allowed(false);
  utils::set_is_malloc_allowed(false);
  {
    S.retractation(z, x, p);
    S.pseudoLog(d, y, x);
    S.pseudoLog0(d, x);
    S.applyDiffRetractation(J1, J0, x);
    S.applyDiffPseudoLog0(J2, J1, x);
    S.applyTransport(H1, H0, x, p);
    S.applyInvTransportOnTheRight(H2, H0, x, p);
  }
  utils::set_is_malloc_allowed(true);
  Eigen::internal::set_is_malloc_allowed(true);
}